

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_3::detail::exception::name
                   (string *__return_storage_ptr__,string *ename,int id_)

{
  char (*in_stack_ffffffffffffff88) [3];
  string local_40;
  undefined1 local_1d [9];
  int id__local;
  string *ename_local;
  
  local_1d[0] = (_Alloc_hider)0x2e;
  local_1d._1_4_ = id_;
  unique0x1000007e = ename;
  ename_local = __return_storage_ptr__;
  std::__cxx11::to_string(&local_40,id_);
  concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
            (__return_storage_ptr__,(detail *)"[json.exception.",(char (*) [17])ename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d,
             (char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x161778,
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return concat("[json.exception.", ename, '.', std::to_string(id_), "] ");
    }